

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_posix.cpp
# Opt level: O1

void __thiscall
pstore::file::file_handle::write_buffer
          (file_handle *this,not_null<const_void_*> buffer,size_t nbytes)

{
  int err;
  pointer pcVar1;
  ssize_t sVar2;
  int *piVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  if (this->file_ == -1) {
    raise<std::errc>(bad_file_descriptor);
  }
  sVar2 = write(this->file_,buffer.ptr_,nbytes);
  if (sVar2 != -1) {
    if (this->is_writable_ != false) {
      return;
    }
    assert_failed("is_writable_",
                  "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/lib/os/file_posix.cpp"
                  ,0x140);
  }
  piVar3 = __errno_location();
  err = *piVar3;
  local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
  pcVar1 = (this->path_)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_38,pcVar1,pcVar1 + (this->path_)._M_string_length);
  (anonymous_namespace)::raise_file_error<char_const*,std::__cxx11::string>
            (err,"write failed",&local_38);
}

Assistant:

void file_handle::write_buffer (gsl::not_null<void const *> const buffer,
                                        std::size_t const nbytes) {
            this->ensure_open ();

            if (::write (file_, buffer.get (), nbytes) == -1) {
                int const err = errno;
                raise_file_error (err, "write failed", this->path ());
            }

            // If the write call succeeded, then the file must have been writable!
            PSTORE_ASSERT (is_writable_);
        }